

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode Array_encodeBinary(void *src,size_t length,UA_DataType *type)

{
  UA_Byte *pUVar1;
  UA_encodeBinarySignature p_Var2;
  UA_Byte *pUVar3;
  UA_StatusCode UVar4;
  UA_StatusCode UVar5;
  ulong uVar6;
  ulong uVar7;
  size_t finished;
  long lVar8;
  int iVar9;
  size_t sVar10;
  bool bVar11;
  
  pUVar3 = end;
  UVar5 = 0x80020000;
  if (length < 0x80000000) {
    pUVar1 = pos + 4;
    UVar5 = 0x80080000;
    if (pUVar1 <= end) {
      iVar9 = -(uint)(src != (void *)0x1);
      if (length != 0) {
        iVar9 = (int)length;
      }
      *(int *)pos = iVar9;
      pos = pos + 4;
      UVar5 = 0;
    }
    if (length != 0 && pUVar1 <= pUVar3) {
      if ((type->field_0x25 & 4) == 0) {
        uVar6 = 0x19;
        if ((type->field_0x25 & 1) != 0) {
          uVar6 = (ulong)type->typeIndex;
        }
        p_Var2 = encodeBinaryJumpTable[uVar6];
        uVar6 = 0;
        do {
          pUVar3 = pos;
          UVar4 = (*p_Var2)(src,type);
          src = (void *)((ulong)type->memSize + (long)src);
          if (UVar4 == 0) {
            bVar11 = true;
          }
          else {
            if (UVar4 == 0x80080000) {
              pos = pUVar3;
              UVar4 = exchangeBuffer();
              src = (void *)((long)src - (ulong)type->memSize);
              uVar6 = uVar6 - 1;
            }
            bVar11 = UVar4 == 0;
            if (!bVar11) {
              UVar5 = UVar4;
            }
          }
          if (!bVar11) {
            return UVar5;
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < length);
LAB_0012ac60:
        UVar5 = 0;
      }
      else {
        uVar6 = (ulong)type->memSize;
        lVar8 = 0;
        do {
          sVar10 = (length - lVar8) * uVar6;
          if (pos + sVar10 <= end) {
            memcpy(pos,src,sVar10);
            pos = pos + sVar10;
            goto LAB_0012ac60;
          }
          uVar7 = (ulong)((long)end - (long)pos) / uVar6;
          sVar10 = uVar7 * uVar6;
          memcpy(pos,src,sVar10);
          pos = pos + sVar10;
          src = (void *)((long)src + sVar10);
          lVar8 = lVar8 + uVar7;
          UVar5 = exchangeBuffer();
        } while (UVar5 == 0);
      }
    }
  }
  return UVar5;
}

Assistant:

static UA_StatusCode
Array_encodeBinary(const void *src, size_t length, const UA_DataType *type) {
    /* Check and convert the array length to int32 */
    UA_Int32 signed_length = -1;
    if(length > UA_INT32_MAX)
        return UA_STATUSCODE_BADINTERNALERROR;
    if(length > 0)
        signed_length = (UA_Int32)length;
    else if(src == UA_EMPTY_ARRAY_SENTINEL)
        signed_length = 0;

    /* Encode the array length */
    UA_StatusCode retval = Int32_encodeBinary(&signed_length);
    if(retval != UA_STATUSCODE_GOOD || length == 0)
        return retval;

    /* Encode the content */
    if(!type->overlayable)
        return Array_encodeBinaryComplex((uintptr_t)src, length, type);
    return Array_encodeBinaryOverlayable((uintptr_t)src, length, type->memSize);
}